

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O3

void Map_TimeComputeRequiredGlobal(Map_Man_t *p)

{
  long lVar1;
  float fVar2;
  int iVar3;
  Map_Node_t **ppMVar4;
  Map_Node_t *pMVar5;
  Scl_Con_t *pSVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  
  bVar12 = false;
  iVar10 = 0;
  pSVar6 = Scl_ConReadMan();
  if (pSVar6 != (Scl_Con_t *)0x0) {
    pSVar6 = Scl_ConReadMan();
    iVar3 = (pSVar6->vOutReqs).nSize;
    if (0 < (long)iVar3) {
      lVar8 = 0;
      iVar10 = 0;
      do {
        iVar10 = iVar10 + (uint)((pSVar6->vOutReqs).pArray[lVar8] == 0);
        lVar8 = lVar8 + 1;
      } while (iVar3 != lVar8);
    }
    bVar12 = iVar10 != iVar3;
  }
  fVar13 = Map_TimeComputeArrivalMax(p);
  p->fRequiredGlo = fVar13;
  fVar14 = p->DelayTarget;
  if ((fVar14 != -1.0) || (NAN(fVar14))) {
    if (fVar13 <= fVar14 + p->fEpsilon) {
      if (fVar13 < fVar14 - p->fEpsilon) {
        if ((p->fMappingMode == 1) && (p->fVerbose != 0)) {
          printf("Relaxing the required times from (%4.2f) to the target (%4.2f).\n",
                 SUB84((double)fVar13,0),(double)fVar14);
          fVar14 = p->DelayTarget;
        }
        p->fRequiredGlo = fVar14;
      }
    }
    else if (p->fMappingMode == 1) {
      printf("Cannot meet the target required times (%4.2f). Continue anyway.\n",
             SUB84((double)fVar14,0));
    }
  }
  lVar8 = (long)p->vMapObjs->nSize;
  if (0 < lVar8) {
    ppMVar4 = p->vMapObjs->pArray;
    lVar9 = 0;
    do {
      pMVar5 = ppMVar4[lVar9];
      pMVar5->tRequired[0].Rise = 3.4028235e+37;
      pMVar5->tRequired[0].Fall = 3.4028235e+37;
      *(undefined8 *)&pMVar5->tRequired[0].Worst = 0x7dcccccc7dcccccc;
      pMVar5->tRequired[1].Fall = 3.4028235e+37;
      pMVar5->tRequired[1].Worst = 3.4028235e+37;
      lVar9 = lVar9 + 1;
    } while (lVar8 != lVar9);
  }
  if (0 < p->nOutputs) {
    lVar8 = 2;
    lVar9 = 0;
    do {
      uVar7 = (ulong)(~(uint)p->pOutputs[lVar9] & 1);
      uVar11 = (ulong)p->pOutputs[lVar9] & 0xfffffffffffffffe;
      lVar1 = uVar11 + uVar7 * 0xc;
      if (bVar12) {
        pSVar6 = Scl_ConReadMan();
        if ((pSVar6->vOutReqs).nSize <= lVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        fVar14 = (float)(pSVar6->vOutReqs).pArray[lVar9] / 1000.0;
        if ((fVar14 <= 0.0) ||
           ((fVar2 = *(float *)(lVar1 + 0x68), fVar13 = fVar14, fVar14 < fVar2 &&
            (fVar13 = fVar2, fVar2 <= fVar14)))) {
LAB_00401fa3:
          fVar13 = p->fRequiredGlo;
        }
      }
      else if (((p->pOutputRequireds == (Map_Time_t *)0x0) ||
               (fVar14 = (&p->pOutputRequireds->Rise)[lVar8], fVar14 <= 0.0)) ||
              ((fVar13 = fVar14, fVar14 < *(float *)(lVar1 + 0x68) &&
               (fVar13 = *(float *)(lVar1 + 0x68), *(float *)(lVar1 + 0x68) <= fVar14))))
      goto LAB_00401fa3;
      lVar1 = uVar11 + uVar7 * 0xc;
      *(float *)(lVar1 + 0x80) = fVar13;
      *(float *)(lVar1 + 0x7c) = fVar13;
      *(float *)(lVar1 + 0x78) = fVar13;
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 3;
    } while (lVar9 < p->nOutputs);
  }
  Map_TimePropagateRequired(p);
  return;
}

Assistant:

void Map_TimeComputeRequiredGlobal( Map_Man_t * p )
{
    int fUseConMan = Scl_ConIsRunning() && Scl_ConHasOutReqs();
    Map_Time_t * ptTime, * ptTimeA;
    int fPhase, i; 
    // update the required times according to the target
    p->fRequiredGlo = Map_TimeComputeArrivalMax( p );
    if ( p->DelayTarget != -1 )
    {
        if ( p->fRequiredGlo > p->DelayTarget + p->fEpsilon )
        {
            if ( p->fMappingMode == 1 )
                printf( "Cannot meet the target required times (%4.2f). Continue anyway.\n", p->DelayTarget );
        }
        else if ( p->fRequiredGlo < p->DelayTarget - p->fEpsilon )
        {
            if ( p->fMappingMode == 1 && p->fVerbose )
                printf( "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->fRequiredGlo, p->DelayTarget );
            p->fRequiredGlo = p->DelayTarget;
        }
    }
    // clean the required times
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        p->vMapObjs->pArray[i]->tRequired[0].Rise  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[0].Fall  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[0].Worst = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Rise  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Fall  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Worst = MAP_FLOAT_LARGE;
    }
    // set the required times for the POs
    for ( i = 0; i < p->nOutputs; i++ )
    {
        fPhase  = !Map_IsComplement(p->pOutputs[i]);
        ptTime  =  Map_Regular(p->pOutputs[i])->tRequired + fPhase;
        ptTimeA =  Map_Regular(p->pOutputs[i])->tArrival + fPhase;

        if ( fUseConMan )
        {
            float Value = Scl_ConGetOutReqFloat(i);
            // if external required time can be achieved, use it
            if ( Value > 0 && ptTimeA->Worst <= Value )//&& Value <= p->fRequiredGlo )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = Value;
            // if external required cannot be achieved, set the earliest possible arrival time
            else if ( Value > 0 && ptTimeA->Worst > Value )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = ptTimeA->Worst;
            // otherwise, set the global required time
            else
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->fRequiredGlo;
        }
        else
        {
            // if external required time can be achieved, use it
            if ( p->pOutputRequireds && p->pOutputRequireds[i].Worst > 0 && ptTimeA->Worst <= p->pOutputRequireds[i].Worst )//&& p->pOutputRequireds[i].Worst <= p->fRequiredGlo )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->pOutputRequireds[i].Worst;
            // if external required cannot be achieved, set the earliest possible arrival time
            else if ( p->pOutputRequireds && p->pOutputRequireds[i].Worst > 0 && ptTimeA->Worst > p->pOutputRequireds[i].Worst )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = ptTimeA->Worst;
            // otherwise, set the global required time
            else
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->fRequiredGlo;
        }
    }
    // visit nodes in the reverse topological order
    Map_TimePropagateRequired( p );
}